

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O3

Nm_Man_t * Nm_ManCreate(int nSize)

{
  uint uVar1;
  Nm_Man_t *pNVar2;
  Nm_Entry_t **ppNVar3;
  Extra_MmFlex_t *pEVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  pNVar2 = (Nm_Man_t *)calloc(1,0x28);
  pNVar2->nSizeFactor = 2;
  pNVar2->nGrowthFactor = 3;
  uVar6 = nSize - 1;
  while( true ) {
    do {
      uVar7 = uVar6 + 1;
      uVar1 = uVar6 & 1;
      uVar6 = uVar7;
    } while (uVar1 != 0);
    if (uVar7 < 9) break;
    iVar5 = 5;
    while (uVar7 % (iVar5 - 2U) != 0) {
      uVar1 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar7 < uVar1) goto LAB_004307e8;
    }
  }
LAB_004307e8:
  pNVar2->nBins = uVar7;
  ppNVar3 = (Nm_Entry_t **)calloc(1,(long)(int)uVar7 << 3);
  pNVar2->pBinsI2N = ppNVar3;
  ppNVar3 = (Nm_Entry_t **)calloc(1,(long)(int)uVar7 << 3);
  pNVar2->pBinsN2I = ppNVar3;
  pEVar4 = Extra_MmFlexStart();
  pNVar2->pMem = pEVar4;
  return pNVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the name manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nm_Man_t * Nm_ManCreate( int nSize )
{
    Nm_Man_t * p;
    // allocate the table
    p = ABC_ALLOC( Nm_Man_t, 1 );
    memset( p, 0, sizeof(Nm_Man_t) );
    // set the parameters
    p->nSizeFactor   = 2; // determined the limit on the grow of data before the table resizes
    p->nGrowthFactor = 3; // determined how much the table grows after resizing
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(nSize);
    p->pBinsI2N = ABC_ALLOC( Nm_Entry_t *, p->nBins );
    p->pBinsN2I = ABC_ALLOC( Nm_Entry_t *, p->nBins );
    memset( p->pBinsI2N, 0, sizeof(Nm_Entry_t *) * p->nBins );
    memset( p->pBinsN2I, 0, sizeof(Nm_Entry_t *) * p->nBins );
    // start the memory manager
    p->pMem = Extra_MmFlexStart();
    return p;
}